

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O1

bool __thiscall NanoVM::execute(NanoVM *this,Instruction *inst)

{
  ulong uVar1;
  uchar uVar2;
  uchar uVar3;
  ulong *puVar4;
  byte bVar5;
  ushort uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uchar *puVar9;
  uint64_t *puVar10;
  uint uVar11;
  uint64_t *puVar12;
  char *__format;
  bool bVar13;
  bool bVar14;
  
  if (inst->isDstMem == true) {
    puVar12 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[inst->dstReg]);
  }
  else {
    puVar12 = (this->cpu).registers + inst->dstReg;
  }
  if (inst->srcType == '\0') {
    if (inst->isSrcMem == false) {
      puVar10 = (this->cpu).registers + inst->srcReg;
    }
    else {
      puVar10 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[inst->srcReg]);
    }
    bVar5 = 0;
  }
  else {
    puVar10 = (uint64_t *)((this->cpu).codeBase + inst->immediate);
    if (inst->isSrcMem == false) {
      puVar10 = &inst->immediate;
    }
    bVar5 = inst->isDstMem ^ 1;
  }
  if ((((puVar10 != &inst->immediate) && (puVar10 != (this->cpu).registers + inst->srcReg)) &&
      ((puVar4 = (ulong *)(this->cpu).codeBase, puVar10 < puVar4 ||
       ((ulong *)((long)puVar4 + (this->cpu).stackSize + (this->cpu).codeSize) <= puVar10)))) ||
     ((puVar12 != (this->cpu).registers + inst->dstReg &&
      ((puVar4 = (ulong *)(this->cpu).codeBase, puVar12 < puVar4 ||
       ((ulong *)((long)puVar4 + (this->cpu).stackSize + (this->cpu).codeSize) < puVar12)))))) {
    this->errorFlag = ' ';
    return false;
  }
  uVar2 = inst->srcSize;
  uVar3 = inst->opcode;
  if (uVar2 != '\x02') {
    if (uVar2 == '\x01') {
      if (bVar5 != 0) {
        bVar13 = false;
        switch(uVar3) {
        case '\0':
          uVar8 = (ulong)(ushort)*puVar10;
          break;
        case '\x01':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_00101fbe;
        case '\x02':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_00101ff4;
        case '\x03':
          uVar11 = (uint)(ushort)*puVar10;
LAB_00101ffc:
          uVar8 = (ulong)(uVar11 & (uint)*puVar12);
          break;
        case '\x04':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_0010206f;
        case '\x05':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_00102045;
        case '\x06':
          goto switchD_00101909_caseD_6;
        case '\a':
          goto switchD_00101909_caseD_7;
        default:
          goto switchD_00101909_caseD_8;
        case '\n':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_0010204c;
        case '\v':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_00102030;
        case '\f':
          uVar8 = (ulong)(ushort)*puVar10;
          goto LAB_00101f5a;
        case '\r':
          goto switchD_00101932_caseD_d;
        case '\x0e':
          goto switchD_00101932_caseD_e;
        case '\x0f':
          goto switchD_00101932_caseD_f;
        case '\x10':
          goto switchD_00101932_caseD_10;
        case '\x11':
          goto switchD_00101932_caseD_11;
        case '\x12':
          goto switchD_00101932_caseD_12;
        case '\x14':
          goto switchD_00101932_caseD_14;
        case '\x15':
          goto switchD_00101932_caseD_15;
        case '\x16':
          goto switchD_00101909_caseD_16;
        case '\x17':
          goto switchD_00101932_caseD_17;
        case '\x18':
          goto switchD_00101932_caseD_18;
        case '\x19':
          goto switchD_00101932_caseD_19;
        case '\x1b':
          goto switchD_00101932_caseD_1b;
        case '\x1c':
          goto switchD_00101909_caseD_1c;
        case '\x1d':
          goto switchD_00101932_caseD_1d;
        }
        goto LAB_00102050;
      }
      bVar13 = false;
      switch(uVar3) {
      case '\0':
        uVar6 = (ushort)*puVar10;
        goto LAB_0010209b;
      case '\x01':
        *(ushort *)puVar12 = (ushort)*puVar12 + (ushort)*puVar10;
        break;
      case '\x02':
        *(ushort *)puVar12 = (ushort)*puVar12 - (ushort)*puVar10;
        break;
      case '\x03':
        *(ushort *)puVar12 = (ushort)*puVar12 & (ushort)*puVar10;
        break;
      case '\x04':
        *(ushort *)puVar12 = (ushort)*puVar12 | (ushort)*puVar10;
        break;
      case '\x05':
        *(ushort *)puVar12 = (ushort)*puVar12 ^ (ushort)*puVar10;
        break;
      case '\x06':
        uVar6 = (ushort)*puVar12 >> ((byte)*puVar10 & 0x1f);
        goto LAB_00102029;
      case '\a':
        uVar6 = (ushort)*puVar12 << ((byte)*puVar10 & 0x1f);
        goto LAB_00102029;
      default:
        goto switchD_00101909_caseD_8;
      case '\n':
        uVar6 = (ushort)*puVar12 * (ushort)*puVar10;
        goto LAB_0010209b;
      case '\v':
        uVar6 = (ushort)*puVar12 / (ushort)*puVar10;
LAB_0010209b:
        *(ushort *)puVar12 = uVar6;
        break;
      case '\f':
        *(ushort *)puVar12 = (ushort)*puVar12 % (ushort)*puVar10;
        break;
      case '\r':
switchD_00101932_caseD_d:
        bVar13 = (ushort)*puVar12 < (ushort)*puVar10;
        bVar14 = (ushort)*puVar12 == (ushort)*puVar10;
        goto joined_r0x00101aa7;
      case '\x0e':
switchD_00101932_caseD_e:
        bVar5 = (byte)(this->cpu).registers[9] & 0x80;
        goto joined_r0x00101a4c;
      case '\x0f':
switchD_00101932_caseD_f:
        if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101932_caseD_12;
        break;
      case '\x10':
switchD_00101932_caseD_10:
        bVar5 = (byte)(this->cpu).registers[9] & 0x40;
        goto joined_r0x00101a4c;
      case '\x11':
switchD_00101932_caseD_11:
        bVar5 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101a4c:
        if (bVar5 == 0) break;
switchD_00101932_caseD_12:
        uVar8 = (ulong)(short)(ushort)*puVar10;
        goto LAB_00102058;
      case '\x12':
        goto switchD_00101932_caseD_12;
      case '\x14':
switchD_00101932_caseD_14:
        *(ushort *)puVar10 = (ushort)*puVar10 + 1;
        break;
      case '\x15':
switchD_00101932_caseD_15:
        *(ushort *)puVar10 = (ushort)*puVar10 - 1;
        break;
      case '\x16':
        goto switchD_00101909_caseD_16;
      case '\x17':
switchD_00101932_caseD_17:
        uVar7 = (this->cpu).registers[7];
        if ((uchar *)(uVar7 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
          *(ulong *)((this->cpu).codeBase + uVar7) =
               (ulong)inst->instructionSize + (this->cpu).registers[8];
          puVar12 = (this->cpu).registers + 7;
          *puVar12 = *puVar12 + 8;
        }
        else {
          this->errorFlag = 0x80;
        }
        goto switchD_00101932_caseD_12;
      case '\x18':
switchD_00101932_caseD_18:
        uVar7 = (this->cpu).registers[7];
        puVar9 = (uchar *)(uVar7 + 2);
        if ((this->cpu).stackBase + (this->cpu).stackSize <= puVar9) goto LAB_00101cfa;
        *(ushort *)((this->cpu).codeBase + uVar7) = (ushort)*puVar10;
        goto LAB_00101c13;
      case '\x19':
switchD_00101932_caseD_19:
        uVar7 = (this->cpu).registers[7];
        uVar8 = uVar7 - 2;
        if (uVar8 < (this->cpu).codeSize) {
          this->errorFlag = 0x80;
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)((this->cpu).codeBase + (uVar7 - 2));
          (this->cpu).registers[7] = uVar8;
        }
LAB_00102029:
        *(ushort *)puVar12 = uVar6;
        break;
      case '\x1b':
switchD_00101932_caseD_1b:
        uVar8 = (ulong)(ushort)*puVar10;
        goto LAB_00101d80;
      case '\x1c':
        goto switchD_00101909_caseD_1c;
      case '\x1d':
switchD_00101932_caseD_1d:
        uVar11 = (uint)(ushort)*puVar10;
        goto LAB_00101ab5;
      }
      goto LAB_00102053;
    }
    if (uVar2 == '\0') {
      if (bVar5 != 0) {
        bVar13 = false;
        switch(uVar3) {
        case '\0':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_00102050;
        case '\x01':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_00101fbe;
        case '\x02':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_00101ff4;
        case '\x03':
          uVar11 = (uint)(byte)*puVar10;
          goto LAB_00101ffc;
        case '\x04':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_0010206f;
        case '\x05':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_00102045;
        case '\x06':
          goto switchD_00101909_caseD_6;
        case '\a':
          goto switchD_00101909_caseD_7;
        default:
          goto switchD_00101909_caseD_8;
        case '\n':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_0010204c;
        case '\v':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_00102030;
        case '\f':
          uVar8 = (ulong)(byte)*puVar10;
          goto LAB_00101f5a;
        case '\r':
          goto switchD_00101909_caseD_d;
        case '\x0e':
          goto switchD_00101909_caseD_e;
        case '\x0f':
          goto switchD_00101909_caseD_f;
        case '\x10':
          goto switchD_00101909_caseD_10;
        case '\x11':
          goto switchD_00101909_caseD_11;
        case '\x12':
          goto switchD_00101909_caseD_12;
        case '\x14':
          goto switchD_00101909_caseD_14;
        case '\x15':
          goto switchD_00101909_caseD_15;
        case '\x16':
          goto switchD_00101909_caseD_16;
        case '\x17':
          goto switchD_00101909_caseD_17;
        case '\x18':
          goto switchD_00101909_caseD_18;
        case '\x19':
          goto switchD_00101909_caseD_19;
        case '\x1b':
          goto switchD_00101909_caseD_1b;
        case '\x1c':
          goto switchD_00101909_caseD_1c;
        case '\x1d':
          goto switchD_00101909_caseD_1d;
        }
      }
      bVar13 = false;
      switch(uVar3) {
      case '\0':
        bVar5 = (byte)*puVar10;
        goto LAB_001020af;
      case '\x01':
        *(byte *)puVar12 = (byte)*puVar12 + (byte)*puVar10;
        break;
      case '\x02':
        *(byte *)puVar12 = (byte)*puVar12 - (byte)*puVar10;
        break;
      case '\x03':
        *(byte *)puVar12 = (byte)*puVar12 & (byte)*puVar10;
        break;
      case '\x04':
        *(byte *)puVar12 = (byte)*puVar12 | (byte)*puVar10;
        break;
      case '\x05':
        *(byte *)puVar12 = (byte)*puVar12 ^ (byte)*puVar10;
        break;
      case '\x06':
        bVar5 = (byte)*puVar12 >> ((byte)*puVar10 & 0x1f);
        goto LAB_0010207b;
      case '\a':
        bVar5 = (byte)*puVar12 << ((byte)*puVar10 & 0x1f);
        goto LAB_0010207b;
      default:
        goto switchD_00101909_caseD_8;
      case '\n':
        bVar5 = (byte)*puVar12 * (byte)*puVar10;
        goto LAB_001020af;
      case '\v':
        bVar5 = (byte)*puVar12 / (byte)*puVar10;
LAB_001020af:
        *(byte *)puVar12 = bVar5;
        break;
      case '\f':
        bVar5 = (byte)*puVar12 % (byte)*puVar10;
        goto LAB_0010207b;
      case '\r':
switchD_00101909_caseD_d:
        bVar13 = (byte)*puVar12 < (byte)*puVar10;
        bVar14 = (byte)*puVar12 == (byte)*puVar10;
        if (bVar14) goto LAB_00101c55;
        goto LAB_00101c62;
      case '\x0e':
switchD_00101909_caseD_e:
        bVar5 = (byte)(this->cpu).registers[9] & 0x80;
        goto joined_r0x00101a63;
      case '\x0f':
switchD_00101909_caseD_f:
        if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101909_caseD_12;
        break;
      case '\x10':
switchD_00101909_caseD_10:
        bVar5 = (byte)(this->cpu).registers[9] & 0x40;
        goto joined_r0x00101a63;
      case '\x11':
switchD_00101909_caseD_11:
        bVar5 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101a63:
        if (bVar5 == 0) break;
switchD_00101909_caseD_12:
        uVar8 = (ulong)(char)(byte)*puVar10;
        goto LAB_00102058;
      case '\x12':
        goto switchD_00101909_caseD_12;
      case '\x14':
switchD_00101909_caseD_14:
        *(byte *)puVar10 = (byte)*puVar10 + 1;
        break;
      case '\x15':
switchD_00101909_caseD_15:
        *(byte *)puVar10 = (byte)*puVar10 - 1;
        break;
      case '\x16':
        goto switchD_00101909_caseD_16;
      case '\x17':
switchD_00101909_caseD_17:
        uVar7 = (this->cpu).registers[7];
        if ((uchar *)(uVar7 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
          *(ulong *)((this->cpu).codeBase + uVar7) =
               (ulong)inst->instructionSize + (this->cpu).registers[8];
          puVar12 = (this->cpu).registers + 7;
          *puVar12 = *puVar12 + 8;
        }
        else {
          this->errorFlag = 0x80;
        }
        goto switchD_00101909_caseD_12;
      case '\x18':
switchD_00101909_caseD_18:
        uVar7 = (this->cpu).registers[7];
        if ((this->cpu).stackBase + (this->cpu).stackSize <= (uchar *)(uVar7 + 1))
        goto LAB_00101cfa;
        (this->cpu).codeBase[uVar7] = (byte)*puVar10;
        puVar12 = (this->cpu).registers + 7;
        *puVar12 = *puVar12 + 1;
        break;
      case '\x19':
switchD_00101909_caseD_19:
        uVar7 = (this->cpu).registers[7];
        uVar8 = uVar7 - 1;
        if (uVar8 < (this->cpu).codeSize) {
          this->errorFlag = 0x80;
          bVar5 = 0;
        }
        else {
          bVar5 = (this->cpu).codeBase[uVar7 - 1];
          (this->cpu).registers[7] = uVar8;
        }
LAB_0010207b:
        *(byte *)puVar12 = bVar5;
        break;
      case '\x1b':
switchD_00101909_caseD_1b:
        uVar8 = (ulong)(byte)*puVar10;
        goto LAB_00101d80;
      case '\x1c':
        goto switchD_00101909_caseD_1c;
      case '\x1d':
switchD_00101909_caseD_1d:
        uVar11 = (uint)(byte)*puVar10;
        goto LAB_00101ab5;
      }
      goto LAB_00102053;
    }
    bVar13 = false;
    switch(uVar3) {
    case '\0':
      uVar8 = *puVar10;
      goto LAB_00102050;
    case '\x01':
      uVar8 = *puVar10;
LAB_00101fbe:
      *puVar12 = *puVar12 + uVar8;
      break;
    case '\x02':
      uVar8 = *puVar10;
LAB_00101ff4:
      *puVar12 = *puVar12 - uVar8;
      break;
    case '\x03':
      *puVar12 = *puVar12 & *puVar10;
      break;
    case '\x04':
      uVar8 = *puVar10;
LAB_0010206f:
      *puVar12 = *puVar12 | uVar8;
      break;
    case '\x05':
      uVar8 = *puVar10;
LAB_00102045:
      *puVar12 = *puVar12 ^ uVar8;
      break;
    case '\x06':
switchD_00101909_caseD_6:
      *puVar12 = *puVar12 >> ((byte)*puVar10 & 0x3f);
      break;
    case '\a':
switchD_00101909_caseD_7:
      *puVar12 = *puVar12 << ((byte)*puVar10 & 0x3f);
      break;
    default:
      goto switchD_00101909_caseD_8;
    case '\n':
      uVar8 = *puVar12 * *puVar10;
      goto LAB_00102050;
    case '\v':
      uVar8 = *puVar12 / *puVar10;
      goto LAB_00102050;
    case '\f':
      uVar8 = *puVar12 % *puVar10;
      goto LAB_00101f62;
    case '\r':
      if (*puVar12 != *puVar10) {
        if (*puVar10 < *puVar12) goto LAB_00101c68;
        goto LAB_00101be2;
      }
      goto LAB_00101c55;
    case '\x0e':
      bVar5 = (byte)(this->cpu).registers[9] & 0x80;
      goto joined_r0x00101e13;
    case '\x0f':
      if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_0010197f_caseD_12;
      break;
    case '\x10':
      bVar5 = (byte)(this->cpu).registers[9] & 0x40;
      goto joined_r0x00101e13;
    case '\x11':
      bVar5 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101e13:
      if (bVar5 == 0) break;
switchD_0010197f_caseD_12:
      uVar8 = *puVar10;
      goto LAB_00102058;
    case '\x12':
      goto switchD_0010197f_caseD_12;
    case '\x14':
      *puVar10 = *puVar10 + 1;
      break;
    case '\x15':
      *puVar10 = *puVar10 - 1;
      break;
    case '\x16':
      goto switchD_00101909_caseD_16;
    case '\x17':
      uVar7 = (this->cpu).registers[7];
      if ((uchar *)(uVar7 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
        *(ulong *)((this->cpu).codeBase + uVar7) =
             (ulong)inst->instructionSize + (this->cpu).registers[8];
        puVar12 = (this->cpu).registers + 7;
        *puVar12 = *puVar12 + 8;
      }
      else {
        this->errorFlag = 0x80;
      }
      goto switchD_0010197f_caseD_12;
    case '\x18':
      uVar7 = (this->cpu).registers[7];
      if ((this->cpu).stackBase + (this->cpu).stackSize <= (uchar *)(uVar7 + 8)) goto LAB_00101cfa;
      *(uint64_t *)((this->cpu).codeBase + uVar7) = *puVar10;
      puVar12 = (this->cpu).registers + 7;
      *puVar12 = *puVar12 + 8;
      break;
    case '\x19':
      uVar7 = (this->cpu).registers[7];
      uVar1 = uVar7 - 8;
      if (uVar1 < (this->cpu).codeSize) {
        this->errorFlag = 0x80;
        uVar8 = 0;
      }
      else {
        uVar8 = *(ulong *)((this->cpu).codeBase + (uVar7 - 8));
        (this->cpu).registers[7] = uVar1;
      }
      goto LAB_00102050;
    case '\x1b':
      puVar10 = (uint64_t *)*puVar10;
      __format = "%lu";
      goto LAB_00101ac9;
    case '\x1c':
      goto switchD_00101909_caseD_1c;
    case '\x1d':
      goto switchD_0010197f_caseD_1d;
    }
    goto LAB_00102053;
  }
  if (bVar5 == 0) {
    bVar13 = false;
    switch(uVar3) {
    case '\0':
      uVar11 = (uint)*puVar10;
      goto LAB_001020a6;
    case '\x01':
      *(uint *)puVar12 = (uint)*puVar12 + (uint)*puVar10;
      break;
    case '\x02':
      *(uint *)puVar12 = (uint)*puVar12 - (uint)*puVar10;
      break;
    case '\x03':
      *(uint *)puVar12 = (uint)*puVar12 & (uint)*puVar10;
      break;
    case '\x04':
      *(uint *)puVar12 = (uint)*puVar12 | (uint)*puVar10;
      break;
    case '\x05':
      *(uint *)puVar12 = (uint)*puVar12 ^ (uint)*puVar10;
      break;
    case '\x06':
      *(uint *)puVar12 = (uint)*puVar12 >> ((byte)*puVar10 & 0x1f);
      break;
    case '\a':
      *(uint *)puVar12 = (uint)*puVar12 << ((byte)*puVar10 & 0x1f);
      break;
    default:
      goto switchD_00101909_caseD_8;
    case '\n':
      uVar11 = (uint)*puVar12 * (uint)*puVar10;
      goto LAB_001020a6;
    case '\v':
      uVar11 = (uint)*puVar12 / (uint)*puVar10;
LAB_001020a6:
      *(uint *)puVar12 = uVar11;
      break;
    case '\f':
      *(uint *)puVar12 = (uint)*puVar12 % (uint)*puVar10;
      break;
    case '\r':
      goto switchD_0010195b_caseD_d;
    case '\x0e':
      goto switchD_0010195b_caseD_e;
    case '\x0f':
      goto switchD_0010195b_caseD_f;
    case '\x10':
      goto switchD_0010195b_caseD_10;
    case '\x11':
      goto switchD_0010195b_caseD_11;
    case '\x12':
      goto switchD_0010195b_caseD_12;
    case '\x14':
      goto switchD_0010195b_caseD_14;
    case '\x15':
      goto switchD_0010195b_caseD_15;
    case '\x16':
      goto switchD_00101909_caseD_16;
    case '\x17':
      goto switchD_0010195b_caseD_17;
    case '\x18':
      goto switchD_0010195b_caseD_18;
    case '\x19':
      goto switchD_0010195b_caseD_19;
    case '\x1b':
      goto switchD_0010195b_caseD_1b;
    case '\x1c':
      goto switchD_00101909_caseD_1c;
    case '\x1d':
      goto switchD_0010197f_caseD_1d;
    }
    goto LAB_00102053;
  }
  bVar13 = false;
  switch(uVar3) {
  case '\0':
    uVar8 = (ulong)(uint)*puVar10;
    goto LAB_00102050;
  case '\x01':
    uVar8 = (ulong)(uint)*puVar10;
    goto LAB_00101fbe;
  case '\x02':
    uVar8 = (ulong)(uint)*puVar10;
    goto LAB_00101ff4;
  case '\x03':
    uVar8 = (ulong)((uint)*puVar12 & (uint)*puVar10);
    goto LAB_00102050;
  case '\x04':
    uVar8 = (ulong)(uint)*puVar10;
    goto LAB_0010206f;
  case '\x05':
    uVar8 = (ulong)(uint)*puVar10;
    goto LAB_00102045;
  case '\x06':
    goto switchD_00101909_caseD_6;
  case '\a':
    goto switchD_00101909_caseD_7;
  default:
    goto switchD_00101909_caseD_8;
  case '\n':
    uVar8 = (ulong)(uint)*puVar10;
LAB_0010204c:
    uVar8 = uVar8 * *puVar12;
    goto LAB_00102050;
  case '\v':
    uVar8 = (ulong)(uint)*puVar10;
LAB_00102030:
    uVar8 = *puVar12 / uVar8;
LAB_00102050:
    *puVar12 = uVar8;
    break;
  case '\f':
    uVar8 = (ulong)(uint)*puVar10;
LAB_00101f5a:
    uVar8 = *puVar12 % uVar8;
LAB_00101f62:
    *puVar12 = uVar8;
    break;
  case '\r':
switchD_0010195b_caseD_d:
    bVar13 = (uint)*puVar12 < (uint)*puVar10;
    bVar14 = (uint)*puVar12 == (uint)*puVar10;
joined_r0x00101aa7:
    if (bVar14) {
LAB_00101c55:
      (this->cpu).registers[9] = 0x80;
    }
    else {
LAB_00101c62:
      if (bVar13 || bVar14) {
LAB_00101be2:
        (this->cpu).registers[9] = 0x20;
      }
      else {
LAB_00101c68:
        (this->cpu).registers[9] = 0x40;
      }
    }
    break;
  case '\x0e':
switchD_0010195b_caseD_e:
    bVar5 = (byte)(this->cpu).registers[9] & 0x80;
    goto joined_r0x00101d22;
  case '\x0f':
switchD_0010195b_caseD_f:
    if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_0010195b_caseD_12;
    break;
  case '\x10':
switchD_0010195b_caseD_10:
    bVar5 = (byte)(this->cpu).registers[9] & 0x40;
    goto joined_r0x00101d22;
  case '\x11':
switchD_0010195b_caseD_11:
    bVar5 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101d22:
    if (bVar5 == 0) break;
switchD_0010195b_caseD_12:
    uVar8 = (ulong)(int)(uint)*puVar10;
    goto LAB_00102058;
  case '\x12':
    goto switchD_0010195b_caseD_12;
  case '\x14':
switchD_0010195b_caseD_14:
    *(uint *)puVar10 = (uint)*puVar10 + 1;
    break;
  case '\x15':
switchD_0010195b_caseD_15:
    *(uint *)puVar10 = (uint)*puVar10 - 1;
    break;
  case '\x16':
    goto switchD_00101909_caseD_16;
  case '\x17':
switchD_0010195b_caseD_17:
    uVar7 = (this->cpu).registers[7];
    if ((uchar *)(uVar7 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
      *(ulong *)((this->cpu).codeBase + uVar7) =
           (ulong)inst->instructionSize + (this->cpu).registers[8];
      puVar12 = (this->cpu).registers + 7;
      *puVar12 = *puVar12 + 8;
    }
    else {
      this->errorFlag = 0x80;
    }
    goto switchD_0010195b_caseD_12;
  case '\x18':
switchD_0010195b_caseD_18:
    uVar7 = (this->cpu).registers[7];
    puVar9 = (uchar *)(uVar7 + 4);
    if (puVar9 < (this->cpu).stackBase + (this->cpu).stackSize) {
      *(uint *)((this->cpu).codeBase + uVar7) = (uint)*puVar10;
LAB_00101c13:
      (this->cpu).registers[7] = (uint64_t)puVar9;
    }
    else {
LAB_00101cfa:
      this->errorFlag = 0x80;
    }
    break;
  case '\x19':
switchD_0010195b_caseD_19:
    uVar7 = (this->cpu).registers[7];
    uVar8 = uVar7 - 4;
    if (uVar8 < (this->cpu).codeSize) {
      this->errorFlag = 0x80;
      uVar11 = 0;
    }
    else {
      uVar11 = *(uint *)((this->cpu).codeBase + (uVar7 - 4));
      (this->cpu).registers[7] = uVar8;
    }
    goto LAB_001020a6;
  case '\x1b':
switchD_0010195b_caseD_1b:
    uVar8 = (ulong)(uint)*puVar10;
LAB_00101d80:
    printf("%lu",uVar8);
    break;
  case '\x1c':
switchD_00101909_caseD_1c:
    __format = "%s";
LAB_00101ac9:
    printf(__format,puVar10);
    break;
  case '\x1d':
switchD_0010197f_caseD_1d:
    uVar11 = (uint)*puVar10;
LAB_00101ab5:
    putchar(uVar11);
  }
LAB_00102053:
  uVar8 = (ulong)inst->instructionSize;
LAB_00102058:
  puVar12 = (this->cpu).registers + 8;
  *puVar12 = *puVar12 + uVar8;
LAB_0010205c:
  bVar13 = true;
switchD_00101909_caseD_8:
  return bVar13;
switchD_00101909_caseD_16:
  uVar7 = (this->cpu).registers[7];
  uVar8 = uVar7 - 8;
  if (uVar8 < (this->cpu).codeSize) {
    this->errorFlag = 0x80;
    uVar7 = 0;
  }
  else {
    uVar7 = *(uint64_t *)((this->cpu).codeBase + (uVar7 - 8));
    (this->cpu).registers[7] = uVar8;
  }
  (this->cpu).registers[8] = uVar7;
  goto LAB_0010205c;
}

Assistant:

bool NanoVM::execute(Instruction &inst) {
	// set source and destination addresses
	void *dst, *src;
	bool isDstReg = false;
	dst = (inst.isDstMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.dstReg]) : reinterpret_cast<void*>(&cpu.registers[inst.dstReg]);
	if (inst.srcType == DataType::Reg) {
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.srcReg]) : reinterpret_cast<void*>(&cpu.registers[inst.srcReg]);
	}
	else {
		isDstReg = (inst.isDstMem) ? false : true;
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + inst.immediate) : reinterpret_cast<void*>(&inst.immediate);
	}
	// Do bounds check
	if ((src != &inst.immediate && src != &cpu.registers[inst.srcReg] && (src < cpu.codeBase || src >= cpu.codeBase + cpu.codeSize + cpu.stackSize)) || (dst != &cpu.registers[inst.dstReg] && (dst < cpu.codeBase || dst > cpu.codeBase + cpu.codeSize + cpu.stackSize))) {
		// Source or destination is out side of VM memory
		errorFlag = MEMORY_ACCESS;
		return false;
	}

	#define MATHOP(INST, OP, SIZE, DSTSIZE) \
    case INST: {         \
		*reinterpret_cast<DSTSIZE*>(dst) OP *reinterpret_cast<SIZE*>(src); \
		break; \
    }

	//USIZE is unsigned and SIZE is signed type => e.g. uint8_t and int8_t 
	#define BRANCH(USIZE, SIZE, DSTSIZE) \
	switch(inst.opcode) { \
		MATHOP(Opcodes::Add, +=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mov, =, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sub, -=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Xor, ^=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::And, &=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Or, |=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sar, >>=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sal, <<=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Div, /=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mul, *=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mod, %=, USIZE, DSTSIZE) \
	case Opcodes::Printi: \
		std::printf("%" PRIu64 "", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Prints: \
		std::printf("%s", src); \
		break; \
	case Opcodes::Printc: \
		std::printf("%c", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Inc: \
		*reinterpret_cast<USIZE*>(src) += 1; \
		break; \
	case Opcodes::Dec: \
		*reinterpret_cast<USIZE*>(src) -= 1; \
		break; \
	case Opcodes::Push: \
		push(*reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Pop: \
		*reinterpret_cast<USIZE*>(dst) = pop<USIZE>(); \
		break; \
	case Opcodes::Jz: \
		if (cpu.registers[flags] & ZERO_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jnz: \
		if (!(cpu.registers[flags] & ZERO_FLAG)) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jg: \
		if (cpu.registers[flags] & GREATER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Js: \
		if (cpu.registers[flags] & SMALLER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jmp: \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Call: \
		push(cpu.registers[ip] + inst.instructionSize); \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Ret: \
		cpu.registers[ip] = pop<uint64_t>(); \
		return true; \
	case Opcodes::Cmp: \
		if (*reinterpret_cast<USIZE*>(dst) == *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = ZERO_FLAG; \
		else if (*reinterpret_cast<USIZE*>(dst) > *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = GREATER_FLAG; \
		else \
			cpu.registers[flags] = SMALLER_FLAG; \
		break; \
	default: \
		return false; \
	}


	switch (inst.srcSize) {	
	case Size::Byte: 
		if (isDstReg) {
			BRANCH(uint8_t, int8_t, uint64_t);
		}
		else {
			BRANCH(uint8_t, int8_t, uint8_t);
		}
		break; 
	case Size::Short: 
		if (isDstReg) {
			BRANCH(uint16_t, int16_t, uint64_t);
		}
		else {
			BRANCH(uint16_t, int16_t, uint16_t);
		}
		break;
	case Size::Dword: 
		if (isDstReg) {
			BRANCH(uint32_t, int32_t, uint64_t);
		}
		else {
			BRANCH(uint32_t, int32_t, uint32_t);
		}
		break;
	default:
		BRANCH(uint64_t, int64_t, uint64_t);
		break;
	} 
	cpu.registers[ip] += inst.instructionSize;
	return true;
}